

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomWidget::read(DomWidget *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  DomProperty *this_00;
  DomRow *this_01;
  DomColumn *this_02;
  DomItem *this_03;
  DomLayout *this_04;
  DomWidget *this_05;
  DomAction *this_06;
  DomActionGroup *this_07;
  DomActionRef *this_08;
  size_t sVar3;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  QXmlStreamAttribute *attribute;
  QXmlStreamAttribute *pQVar4;
  undefined4 in_register_00000034;
  QXmlStreamReader *this_09;
  char *pcVar5;
  QStringList *this_10;
  QList<DomProperty_*> *this_11;
  long lVar6;
  long in_FS_OFFSET;
  QStringView other;
  QStringView other_00;
  QStringView other_01;
  QStringView other_02;
  QStringView other_03;
  QStringView other_04;
  QStringView other_05;
  QStringView other_06;
  QStringView other_07;
  QStringView other_08;
  QStringView other_09;
  QStringView other_10;
  QStringView other_11;
  QStringView other_12;
  QArrayDataPointer<char16_t> local_b0;
  char *local_98;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_90;
  QStringView local_78;
  QStringView local_68;
  QArrayDataPointer<QXmlStreamAttribute> local_50;
  long local_38;
  
  this_09 = (QXmlStreamReader *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  lVar6 = 0;
  pQVar4 = local_50.ptr;
  while( true ) {
    if (local_50.size * 0x68 == lVar6) break;
    local_68.m_data = *(storage_type_conflict **)(pQVar4 + 8);
    local_68.m_size = *(qsizetype *)(pQVar4 + 0x10);
    Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"class",5);
    bVar1 = comparesEqual(&local_68,(QStringView *)&local_90);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
    if (bVar1) {
      local_90.a.m_data = *(char **)(local_50.ptr + lVar6 + 0x50);
      local_90.a.m_size = *(qsizetype *)(local_50.ptr + lVar6 + 0x58);
      QStringView::toString((QString *)&local_b0,(QStringView *)&local_90);
      setAttributeClass(this,(QString *)&local_b0);
    }
    else {
      Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"name",4);
      bVar1 = comparesEqual(&local_68,(QStringView *)&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
      if (bVar1) {
        local_90.a.m_data = *(char **)(local_50.ptr + lVar6 + 0x50);
        local_90.a.m_size = *(qsizetype *)(local_50.ptr + lVar6 + 0x58);
        QStringView::toString((QString *)&local_b0,(QStringView *)&local_90);
        setAttributeName(this,(QString *)&local_b0);
      }
      else {
        Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"native",6);
        bVar1 = comparesEqual(&local_68,(QStringView *)&local_90);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
        if (bVar1) {
          local_90.a.m_data = *(char **)(local_50.ptr + lVar6 + 0x50);
          local_90.a.m_size = *(qsizetype *)(local_50.ptr + lVar6 + 0x58);
          Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"true",4);
          bVar1 = comparesEqual((QStringView *)&local_90,&local_78);
          this->m_attr_native = bVar1;
          this->m_has_attr_native = true;
        }
        else {
          local_90.a.m_size = 0x15;
          local_90.a.m_data = "Unexpected attribute ";
          local_90.b = &local_68;
          QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                    ((QString *)&local_b0,&local_90);
          QXmlStreamReader::raiseError((QString *)this_09);
        }
      }
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
    pQVar4 = pQVar4 + 0x68;
    lVar6 = lVar6 + 0x68;
  }
LAB_0014c476:
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError(this_09);
      if (bVar1) goto LAB_0014cb3c;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 == 4) break;
      if (iVar2 == 5) {
LAB_0014cb3c:
        QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_50);
        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
          __stack_chk_fail();
        }
        return *(long *)(in_FS_OFFSET + 0x28);
      }
    }
    local_68.m_size = -0x5555555555555556;
    local_68.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
    local_68 = (QStringView)QXmlStreamReader::name();
    Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"class",5);
    other.m_data._4_4_ = local_b0.ptr._4_4_;
    other.m_data._0_4_ = local_b0.ptr._0_4_;
    other.m_size._4_4_ = local_b0.size._4_4_;
    other.m_size._0_4_ = (undefined4)local_b0.size;
    iVar2 = QStringView::compare(&local_68,other,CaseInsensitive);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
    if (iVar2 != 0) {
      Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"property",8);
      other_00.m_data._4_4_ = local_b0.ptr._4_4_;
      other_00.m_data._0_4_ = local_b0.ptr._0_4_;
      other_00.m_size._4_4_ = local_b0.size._4_4_;
      other_00.m_size._0_4_ = (undefined4)local_b0.size;
      sVar3 = 0;
      iVar2 = QStringView::compare(&local_68,other_00,CaseInsensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
      if (iVar2 == 0) {
        this_00 = (DomProperty *)operator_new(0x178);
        memset(this_00,0,0x178);
        DomProperty::read(this_00,__fd,__buf_00,sVar3);
        this_11 = &this->m_property;
LAB_0014c8b3:
        QList<DomProperty_*>::append(this_11,this_00);
      }
      else {
        Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"script",6);
        other_01.m_data._4_4_ = local_b0.ptr._4_4_;
        other_01.m_data._0_4_ = local_b0.ptr._0_4_;
        other_01.m_size._4_4_ = local_b0.size._4_4_;
        other_01.m_size._0_4_ = (undefined4)local_b0.size;
        iVar2 = QStringView::compare(&local_68,other_01,CaseInsensitive);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
        if (iVar2 == 0) {
          pcVar5 = "Omitting deprecated element <script>.";
        }
        else {
          Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"widgetdata",10);
          other_02.m_data._4_4_ = local_b0.ptr._4_4_;
          other_02.m_data._0_4_ = local_b0.ptr._0_4_;
          other_02.m_size._4_4_ = local_b0.size._4_4_;
          other_02.m_size._0_4_ = (undefined4)local_b0.size;
          iVar2 = QStringView::compare(&local_68,other_02,CaseInsensitive);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
          if (iVar2 != 0) {
            Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"attribute",9);
            other_03.m_data._4_4_ = local_b0.ptr._4_4_;
            other_03.m_data._0_4_ = local_b0.ptr._0_4_;
            other_03.m_size._4_4_ = local_b0.size._4_4_;
            other_03.m_size._0_4_ = (undefined4)local_b0.size;
            sVar3 = 0;
            iVar2 = QStringView::compare(&local_68,other_03,CaseInsensitive);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
            if (iVar2 == 0) {
              this_00 = (DomProperty *)operator_new(0x178);
              memset(this_00,0,0x178);
              DomProperty::read(this_00,__fd,__buf_01,sVar3);
              this_11 = &this->m_attribute;
              goto LAB_0014c8b3;
            }
            Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"row",3);
            other_04.m_data._4_4_ = local_b0.ptr._4_4_;
            other_04.m_data._0_4_ = local_b0.ptr._0_4_;
            other_04.m_size._4_4_ = local_b0.size._4_4_;
            other_04.m_size._0_4_ = (undefined4)local_b0.size;
            sVar3 = 0;
            iVar2 = QStringView::compare(&local_68,other_04,CaseInsensitive);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
            if (iVar2 == 0) {
              this_01 = (DomRow *)operator_new(0x20);
              *(undefined8 *)this_01 = 0;
              (this_01->m_property).d.d = (Data *)0x0;
              (this_01->m_property).d.ptr = (DomProperty **)0x0;
              (this_01->m_property).d.size = 0;
              DomRow::read(this_01,__fd,__buf_02,sVar3);
              QList<DomRow_*>::append(&this->m_row,this_01);
            }
            else {
              Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"column",6);
              other_05.m_data._4_4_ = local_b0.ptr._4_4_;
              other_05.m_data._0_4_ = local_b0.ptr._0_4_;
              other_05.m_size._4_4_ = local_b0.size._4_4_;
              other_05.m_size._0_4_ = (undefined4)local_b0.size;
              sVar3 = 0;
              iVar2 = QStringView::compare(&local_68,other_05,CaseInsensitive);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
              if (iVar2 == 0) {
                this_02 = (DomColumn *)operator_new(0x20);
                *(undefined8 *)this_02 = 0;
                (this_02->m_property).d.d = (Data *)0x0;
                (this_02->m_property).d.ptr = (DomProperty **)0x0;
                (this_02->m_property).d.size = 0;
                DomColumn::read(this_02,__fd,__buf_03,sVar3);
                QList<DomColumn_*>::append(&this->m_column,this_02);
              }
              else {
                Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"item",4);
                other_06.m_data._4_4_ = local_b0.ptr._4_4_;
                other_06.m_data._0_4_ = local_b0.ptr._0_4_;
                other_06.m_size._4_4_ = local_b0.size._4_4_;
                other_06.m_size._0_4_ = (undefined4)local_b0.size;
                sVar3 = 0;
                iVar2 = QStringView::compare(&local_68,other_06,CaseInsensitive);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
                if (iVar2 == 0) {
                  this_03 = (DomItem *)operator_new(0x48);
                  this_03->m_attr_row = 0;
                  this_03->m_has_attr_row = false;
                  *(undefined3 *)&this_03->field_0x5 = 0;
                  this_03->m_attr_column = 0;
                  this_03->m_has_attr_column = false;
                  *(undefined3 *)&this_03->field_0xd = 0;
                  *(undefined8 *)&this_03->m_children = 0;
                  (this_03->m_property).d.d = (Data *)0x0;
                  (this_03->m_property).d.ptr = (DomProperty **)0x0;
                  (this_03->m_property).d.size = 0;
                  (this_03->m_item).d.d = (Data *)0x0;
                  (this_03->m_item).d.ptr = (DomItem **)0x0;
                  (this_03->m_item).d.size = 0;
                  DomItem::read(this_03,__fd,__buf_04,sVar3);
                  QList<DomItem_*>::append(&this->m_item,this_03);
                }
                else {
                  Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"layout",6);
                  other_07.m_data._4_4_ = local_b0.ptr._4_4_;
                  other_07.m_data._0_4_ = local_b0.ptr._0_4_;
                  other_07.m_size._4_4_ = local_b0.size._4_4_;
                  other_07.m_size._0_4_ = (undefined4)local_b0.size;
                  sVar3 = 0;
                  iVar2 = QStringView::compare(&local_68,other_07,CaseInsensitive);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
                  if (iVar2 == 0) {
                    this_04 = (DomLayout *)operator_new(0x128);
                    memset(this_04,0,0x128);
                    DomLayout::DomLayout(this_04);
                    DomLayout::read(this_04,__fd,__buf_05,sVar3);
                    QList<DomLayout_*>::append(&this->m_layout,this_04);
                  }
                  else {
                    Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"widget",6);
                    other_08.m_data._4_4_ = local_b0.ptr._4_4_;
                    other_08.m_data._0_4_ = local_b0.ptr._0_4_;
                    other_08.m_size._4_4_ = local_b0.size._4_4_;
                    other_08.m_size._0_4_ = (undefined4)local_b0.size;
                    sVar3 = 0;
                    iVar2 = QStringView::compare(&local_68,other_08,CaseInsensitive);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
                    if (iVar2 == 0) {
                      this_05 = (DomWidget *)operator_new(0x160);
                      memset(this_05,0,0x160);
                      read(this_05,__fd,__buf_06,sVar3);
                      QList<DomWidget_*>::append(&this->m_widget,this_05);
                    }
                    else {
                      Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"action",6);
                      other_09.m_data._4_4_ = local_b0.ptr._4_4_;
                      other_09.m_data._0_4_ = local_b0.ptr._0_4_;
                      other_09.m_size._4_4_ = local_b0.size._4_4_;
                      other_09.m_size._0_4_ = (undefined4)local_b0.size;
                      sVar3 = 0;
                      iVar2 = QStringView::compare(&local_68,other_09,CaseInsensitive);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
                      if (iVar2 == 0) {
                        this_06 = (DomAction *)operator_new(0x70);
                        (this_06->m_attr_name).d.d = (Data *)0x0;
                        (this_06->m_attr_name).d.ptr = (char16_t *)0x0;
                        (this_06->m_attr_name).d.size = 0;
                        *(undefined8 *)&this_06->m_has_attr_name = 0;
                        (this_06->m_attr_menu).d.d = (Data *)0x0;
                        (this_06->m_attr_menu).d.ptr = (char16_t *)0x0;
                        (this_06->m_attr_menu).d.size = 0;
                        this_06->m_has_attr_menu = false;
                        *(undefined3 *)&this_06->field_0x39 = 0;
                        this_06->m_children = 0;
                        (this_06->m_property).d.d = (Data *)0x0;
                        (this_06->m_property).d.ptr = (DomProperty **)0x0;
                        (this_06->m_property).d.size = 0;
                        (this_06->m_attribute).d.d = (Data *)0x0;
                        (this_06->m_attribute).d.ptr = (DomProperty **)0x0;
                        (this_06->m_attribute).d.size = 0;
                        DomAction::read(this_06,__fd,__buf_07,sVar3);
                        QList<DomAction_*>::append(&this->m_action,this_06);
                      }
                      else {
                        Qt::Literals::StringLiterals::operator____s
                                  ((QString *)&local_b0,L"actiongroup",0xb);
                        other_10.m_data._4_4_ = local_b0.ptr._4_4_;
                        other_10.m_data._0_4_ = local_b0.ptr._0_4_;
                        other_10.m_size._4_4_ = local_b0.size._4_4_;
                        other_10.m_size._0_4_ = (undefined4)local_b0.size;
                        sVar3 = 0;
                        iVar2 = QStringView::compare(&local_68,other_10,CaseInsensitive);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
                        if (iVar2 == 0) {
                          this_07 = (DomActionGroup *)operator_new(0x80);
                          (this_07->m_attr_name).d.d = (Data *)0x0;
                          (this_07->m_attr_name).d.ptr = (char16_t *)0x0;
                          (this_07->m_attr_name).d.size = 0;
                          this_07->m_has_attr_name = false;
                          *(undefined3 *)&this_07->field_0x19 = 0;
                          this_07->m_children = 0;
                          (this_07->m_action).d.d = (Data *)0x0;
                          (this_07->m_action).d.ptr = (DomAction **)0x0;
                          (this_07->m_action).d.size = 0;
                          (this_07->m_actionGroup).d.d = (Data *)0x0;
                          (this_07->m_actionGroup).d.ptr = (DomActionGroup **)0x0;
                          (this_07->m_actionGroup).d.size = 0;
                          (this_07->m_property).d.d = (Data *)0x0;
                          (this_07->m_property).d.ptr = (DomProperty **)0x0;
                          (this_07->m_property).d.size = 0;
                          (this_07->m_attribute).d.d = (Data *)0x0;
                          (this_07->m_attribute).d.ptr = (DomProperty **)0x0;
                          (this_07->m_attribute).d.size = 0;
                          DomActionGroup::read(this_07,__fd,__buf_08,sVar3);
                          QList<DomActionGroup_*>::append(&this->m_actionGroup,this_07);
                        }
                        else {
                          Qt::Literals::StringLiterals::operator____s
                                    ((QString *)&local_b0,L"addaction",9);
                          other_11.m_data._4_4_ = local_b0.ptr._4_4_;
                          other_11.m_data._0_4_ = local_b0.ptr._0_4_;
                          other_11.m_size._4_4_ = local_b0.size._4_4_;
                          other_11.m_size._0_4_ = (undefined4)local_b0.size;
                          sVar3 = 0;
                          iVar2 = QStringView::compare(&local_68,other_11,CaseInsensitive);
                          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
                          if (iVar2 != 0) {
                            Qt::Literals::StringLiterals::operator____s
                                      ((QString *)&local_b0,L"zorder",6);
                            other_12.m_data._4_4_ = local_b0.ptr._4_4_;
                            other_12.m_data._0_4_ = local_b0.ptr._0_4_;
                            other_12.m_size._4_4_ = local_b0.size._4_4_;
                            other_12.m_size._0_4_ = (undefined4)local_b0.size;
                            iVar2 = QStringView::compare(&local_68,other_12,CaseInsensitive);
                            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
                            if (iVar2 == 0) {
                              QXmlStreamReader::readElementText(&local_b0,this_09,0);
                              this_10 = &this->m_zOrder;
                              goto LAB_0014c844;
                            }
                            local_90.a.m_size = 0x13;
                            local_90.a.m_data = "Unexpected element ";
                            local_90.b = &local_68;
                            QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                                      ((QString *)&local_b0,&local_90);
                            QXmlStreamReader::raiseError((QString *)this_09);
                            goto LAB_0014c84c;
                          }
                          this_08 = (DomActionRef *)operator_new(0x20);
                          (this_08->m_attr_name).d.d = (Data *)0x0;
                          (this_08->m_attr_name).d.ptr = (char16_t *)0x0;
                          (this_08->m_attr_name).d.size = 0;
                          *(undefined8 *)&this_08->m_has_attr_name = 0;
                          DomActionRef::read(this_08,__fd,__buf_09,sVar3);
                          QList<DomActionRef_*>::append(&this->m_addAction,this_08);
                        }
                      }
                    }
                  }
                }
              }
            }
            goto LAB_0014c476;
          }
          pcVar5 = "Omitting deprecated element <widgetdata>.";
        }
        local_98 = "default";
        local_b0.size._4_4_ = 0;
        local_b0.size._0_4_ = 0;
        local_b0.ptr._4_4_ = 0;
        local_b0.ptr._0_4_ = 0;
        local_b0.d._4_4_ = 0;
        local_b0.d._0_4_ = 2;
        QMessageLogger::warning((char *)&local_b0,pcVar5);
        QXmlStreamReader::skipCurrentElement();
      }
      goto LAB_0014c476;
    }
    QXmlStreamReader::readElementText(&local_b0,this_09,0);
    this_10 = &this->m_class;
LAB_0014c844:
    QList<QString>::emplaceBack<QString>(this_10,(QString *)&local_b0);
LAB_0014c84c:
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
  } while( true );
}

Assistant:

void DomWidget::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"class"_s) {
            setAttributeClass(attribute.value().toString());
            continue;
        }
        if (name == u"name"_s) {
            setAttributeName(attribute.value().toString());
            continue;
        }
        if (name == u"native"_s) {
            setAttributeNative(attribute.value() == u"true"_s);
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"class"_s, Qt::CaseInsensitive)) {
                m_class.append(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"property"_s, Qt::CaseInsensitive)) {
                auto *v = new DomProperty();
                v->read(reader);
                m_property.append(v);
                continue;
            }
            if (!tag.compare(u"script"_s, Qt::CaseInsensitive)) {
                qWarning("Omitting deprecated element <script>.");
                reader.skipCurrentElement();
                continue;
            }
            if (!tag.compare(u"widgetdata"_s, Qt::CaseInsensitive)) {
                qWarning("Omitting deprecated element <widgetdata>.");
                reader.skipCurrentElement();
                continue;
            }
            if (!tag.compare(u"attribute"_s, Qt::CaseInsensitive)) {
                auto *v = new DomProperty();
                v->read(reader);
                m_attribute.append(v);
                continue;
            }
            if (!tag.compare(u"row"_s, Qt::CaseInsensitive)) {
                auto *v = new DomRow();
                v->read(reader);
                m_row.append(v);
                continue;
            }
            if (!tag.compare(u"column"_s, Qt::CaseInsensitive)) {
                auto *v = new DomColumn();
                v->read(reader);
                m_column.append(v);
                continue;
            }
            if (!tag.compare(u"item"_s, Qt::CaseInsensitive)) {
                auto *v = new DomItem();
                v->read(reader);
                m_item.append(v);
                continue;
            }
            if (!tag.compare(u"layout"_s, Qt::CaseInsensitive)) {
                auto *v = new DomLayout();
                v->read(reader);
                m_layout.append(v);
                continue;
            }
            if (!tag.compare(u"widget"_s, Qt::CaseInsensitive)) {
                auto *v = new DomWidget();
                v->read(reader);
                m_widget.append(v);
                continue;
            }
            if (!tag.compare(u"action"_s, Qt::CaseInsensitive)) {
                auto *v = new DomAction();
                v->read(reader);
                m_action.append(v);
                continue;
            }
            if (!tag.compare(u"actiongroup"_s, Qt::CaseInsensitive)) {
                auto *v = new DomActionGroup();
                v->read(reader);
                m_actionGroup.append(v);
                continue;
            }
            if (!tag.compare(u"addaction"_s, Qt::CaseInsensitive)) {
                auto *v = new DomActionRef();
                v->read(reader);
                m_addAction.append(v);
                continue;
            }
            if (!tag.compare(u"zorder"_s, Qt::CaseInsensitive)) {
                m_zOrder.append(reader.readElementText());
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}